

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Path.cpp
# Opt level: O0

size_t anon_unknown.dwarf_232906::parent_path_end(StringRef path,Style style)

{
  char cVar1;
  size_t sVar2;
  Style in_ECX;
  Style style_00;
  StringRef str;
  StringRef str_00;
  bool local_6a;
  bool local_69;
  size_t root_dir_pos;
  bool filename_was_sep;
  ulong local_38;
  size_t end_pos;
  undefined1 auStack_28 [4];
  Style style_local;
  StringRef path_local;
  
  str.Data = (char *)path.Length;
  _auStack_28 = (anon_unknown_dwarf_232906 *)path.Data;
  str.Length._0_4_ = style;
  str.Length._4_4_ = 0;
  path_local.Data = str.Data;
  local_38 = filename_pos(_auStack_28,str,in_ECX);
  style_00 = (Style)auStack_28;
  local_69 = false;
  if (path_local.Data != (char *)0x0) {
    cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_28,local_38);
    local_69 = llvm::sys::path::is_separator(cVar1,style);
  }
  str_00.Length._0_4_ = style;
  str_00.Data = path_local.Data;
  str_00.Length._4_4_ = 0;
  sVar2 = root_dir_start(_auStack_28,str_00,style_00);
  while( true ) {
    local_6a = false;
    if ((local_38 != 0) && ((sVar2 == 0xffffffffffffffff || (local_6a = false, sVar2 < local_38))))
    {
      cVar1 = llvm::StringRef::operator[]((StringRef *)auStack_28,local_38 - 1);
      local_6a = llvm::sys::path::is_separator(cVar1,style);
    }
    if (local_6a == false) break;
    local_38 = local_38 - 1;
  }
  if ((local_38 == sVar2) && (local_69 == false)) {
    path_local.Length = sVar2 + 1;
  }
  else {
    path_local.Length = local_38;
  }
  return path_local.Length;
}

Assistant:

size_t parent_path_end(StringRef path, Style style) {
    size_t end_pos = filename_pos(path, style);

    bool filename_was_sep =
        path.size() > 0 && is_separator(path[end_pos], style);

    // Skip separators until we reach root dir (or the start of the string).
    size_t root_dir_pos = root_dir_start(path, style);
    while (end_pos > 0 &&
           (root_dir_pos == StringRef::npos || end_pos > root_dir_pos) &&
           is_separator(path[end_pos - 1], style))
      --end_pos;

    if (end_pos == root_dir_pos && !filename_was_sep) {
      // We've reached the root dir and the input path was *not* ending in a
      // sequence of slashes. Include the root dir in the parent path.
      return root_dir_pos + 1;
    }

    // Otherwise, just include before the last slash.
    return end_pos;
  }